

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O0

io_context_pool * coro_io::g_block_io_context_pool<coro_io::io_context_pool>(uint pool_size)

{
  int iVar1;
  element_type *peVar2;
  undefined4 in_EDI;
  anon_class_1_0_00000001 *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffd0;
  byte in_stack_ffffffffffffffd7;
  shared_ptr<coro_io::io_context_pool> local_28 [2];
  undefined4 in_stack_fffffffffffffff8;
  
  if (g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::_g_io_context_pool == '\0') {
    iVar1 = __cxa_guard_acquire(&g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::
                                 _g_io_context_pool);
    if (iVar1 != 0) {
      std::make_shared<coro_io::io_context_pool,unsigned_int&>
                ((uint *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
      __cxa_atexit(std::shared_ptr<coro_io::io_context_pool>::~shared_ptr,
                   &g_block_io_context_pool<coro_io::io_context_pool>::_g_io_context_pool,
                   &__dso_handle);
      __cxa_guard_release(&g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::
                           _g_io_context_pool);
    }
  }
  if (g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::run_helper == '\0') {
    iVar1 = __cxa_guard_acquire(&g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::
                                 run_helper);
    if (iVar1 != 0) {
      std::shared_ptr<coro_io::io_context_pool>::shared_ptr
                ((shared_ptr<coro_io::io_context_pool> *)
                 CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),local_28);
      in_stack_ffffffffffffffd7 =
           g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::{lambda(auto:1)#1}::
           operator()(unaff_retaddr,
                      (shared_ptr<coro_io::io_context_pool> *)
                      CONCAT44(in_EDI,in_stack_fffffffffffffff8));
      std::shared_ptr<coro_io::io_context_pool>::~shared_ptr
                ((shared_ptr<coro_io::io_context_pool> *)0x423938);
      g_block_io_context_pool<coro_io::io_context_pool>::run_helper =
           (bool)(in_stack_ffffffffffffffd7 & 1);
      __cxa_guard_release(&g_block_io_context_pool<coro_io::io_context_pool>(unsigned_int)::
                           run_helper);
    }
  }
  peVar2 = std::
           __shared_ptr_access<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  return peVar2;
}

Assistant:

inline T &g_block_io_context_pool(
    unsigned pool_size = std::thread::hardware_concurrency()) {
  static auto _g_io_context_pool = std::make_shared<T>(pool_size);
  [[maybe_unused]] static bool run_helper = [](auto pool) {
    std::thread thrd{[pool] {
      pool->run();
    }};
    thrd.detach();
    return true;
  }(_g_io_context_pool);
  return *_g_io_context_pool;
}